

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FluctuatingChargeAdapter.cpp
# Opt level: O0

FluctuatingAtypeParameters * __thiscall
OpenMD::FluctuatingChargeAdapter::getFluctuatingChargeParam(FluctuatingChargeAdapter *this)

{
  bool bVar1;
  undefined8 uVar2;
  element_type *this_00;
  FluctuatingAtypeParameters *this_01;
  FluctuatingAtypeParameters *in_RDI;
  shared_ptr<OpenMD::SimpleTypeData<OpenMD::FluctuatingAtypeParameters>_> fqData;
  shared_ptr<OpenMD::GenericData> data;
  AtomType *in_stack_ffffffffffffff18;
  shared_ptr<OpenMD::GenericData> *in_stack_ffffffffffffff20;
  string *in_stack_ffffffffffffff30;
  errorStruct *peVar3;
  AtomType *in_stack_ffffffffffffff38;
  string local_a0 [64];
  undefined1 local_60 [96];
  
  bVar1 = isFluctuatingCharge((FluctuatingChargeAdapter *)0x304b66);
  if (!bVar1) {
    AtomType::getName_abi_cxx11_(in_stack_ffffffffffffff18);
    uVar2 = std::__cxx11::string::c_str();
    snprintf(painCave.errMsg,2000,
             "FluctuatingChargeAdapter::getFluctuatingChargeParam was passed an atomType (%s)\n\tthat does not appear to be a fluctuating charge atom.\n"
             ,uVar2);
    std::__cxx11::string::~string((string *)(local_60 + 0x30));
    painCave.severity = 1;
    painCave.isFatal = 1;
    simError();
  }
  AtomType::getPropertyByName(in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
  bVar1 = std::operator==(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  if (bVar1) {
    AtomType::getName_abi_cxx11_(in_stack_ffffffffffffff18);
    in_stack_ffffffffffffff38 = (AtomType *)local_60;
    uVar2 = std::__cxx11::string::c_str();
    snprintf(painCave.errMsg,2000,
             "FluctuatingChargeAdapter::getFluctuatingChargeParam could not find fluctuating charge\n\tparameters for atomType %s.\n"
             ,uVar2);
    std::__cxx11::string::~string((string *)in_stack_ffffffffffffff38);
    painCave.severity = 1;
    painCave.isFatal = 1;
    simError();
  }
  std::
  dynamic_pointer_cast<OpenMD::SimpleTypeData<OpenMD::FluctuatingAtypeParameters>,OpenMD::GenericData>
            ((shared_ptr<OpenMD::GenericData> *)in_stack_ffffffffffffff38);
  bVar1 = std::operator==((shared_ptr<OpenMD::SimpleTypeData<OpenMD::FluctuatingAtypeParameters>_> *
                          )in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  if (bVar1) {
    AtomType::getName_abi_cxx11_(in_stack_ffffffffffffff18);
    uVar2 = std::__cxx11::string::c_str();
    peVar3 = &painCave;
    snprintf(painCave.errMsg,2000,
             "FluctuatingChargeAdapter::getFluctuatingChargeParam could not convert\n\tGenericData to FluctuatingAtypeData for atom type %s\n"
             ,uVar2);
    std::__cxx11::string::~string(local_a0);
    peVar3->severity = 1;
    peVar3->isFatal = 1;
    simError();
  }
  this_00 = std::
            __shared_ptr_access<OpenMD::SimpleTypeData<OpenMD::FluctuatingAtypeParameters>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<OpenMD::SimpleTypeData<OpenMD::FluctuatingAtypeParameters>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x304d61);
  this_01 = SimpleTypeData<OpenMD::FluctuatingAtypeParameters>::getData(this_00);
  FluctuatingAtypeParameters::FluctuatingAtypeParameters
            (this_01,(FluctuatingAtypeParameters *)in_stack_ffffffffffffff18);
  std::shared_ptr<OpenMD::SimpleTypeData<OpenMD::FluctuatingAtypeParameters>_>::~shared_ptr
            ((shared_ptr<OpenMD::SimpleTypeData<OpenMD::FluctuatingAtypeParameters>_> *)0x304d8b);
  std::shared_ptr<OpenMD::GenericData>::~shared_ptr((shared_ptr<OpenMD::GenericData> *)0x304d98);
  return in_RDI;
}

Assistant:

FluctuatingAtypeParameters
      FluctuatingChargeAdapter::getFluctuatingChargeParam() {
    if (!isFluctuatingCharge()) {
      snprintf(
          painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
          "FluctuatingChargeAdapter::getFluctuatingChargeParam was passed an "
          "atomType "
          "(%s)\n"
          "\tthat does not appear to be a fluctuating charge atom.\n",
          at_->getName().c_str());
      painCave.severity = OPENMD_ERROR;
      painCave.isFatal  = 1;
      simError();
    }

    std::shared_ptr<GenericData> data = at_->getPropertyByName(FQtypeID);
    if (data == nullptr) {
      snprintf(
          painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
          "FluctuatingChargeAdapter::getFluctuatingChargeParam could not find "
          "fluctuating charge\n"
          "\tparameters for atomType %s.\n",
          at_->getName().c_str());
      painCave.severity = OPENMD_ERROR;
      painCave.isFatal  = 1;
      simError();
    }

    std::shared_ptr<FluctuatingAtypeData> fqData =
        std::dynamic_pointer_cast<FluctuatingAtypeData>(data);
    if (fqData == nullptr) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "FluctuatingChargeAdapter::getFluctuatingChargeParam could not "
               "convert\n"
               "\tGenericData to FluctuatingAtypeData for atom type %s\n",
               at_->getName().c_str());
      painCave.severity = OPENMD_ERROR;
      painCave.isFatal  = 1;
      simError();
    }

    return fqData->getData();
  }